

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::TemplatedGetSortKeyLength<duckdb::SortKeyBlobOperator>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyLengthInfo *result)

{
  TYPE input;
  bool bVar1;
  string_t *psVar2;
  idx_t iVar3;
  idx_t iVar4;
  reference pvVar5;
  long in_RDI;
  idx_t result_index;
  idx_t idx;
  idx_t r;
  string_t *data;
  UnifiedVectorFormat *format;
  idx_t in_stack_ffffffffffffffa8;
  SortKeyChunk *this;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  ulong local_28;
  
  this = (SortKeyChunk *)&stack0x00000008;
  psVar2 = UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)(in_RDI + 0x10));
  for (local_28 = this->start; local_28 < this->end; local_28 = local_28 + 1) {
    iVar3 = SelectionVector::get_index(*(SelectionVector **)(in_RDI + 0x10),local_28);
    iVar4 = SortKeyChunk::GetResultIndex(this,local_28);
    pvVar5 = vector<unsigned_long,_false>::operator[]
                       ((vector<unsigned_long,_false> *)this,in_stack_ffffffffffffffa8);
    *pvVar5 = *pvVar5 + 1;
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_stack_ffffffffffffffb8,(idx_t)this);
    if (bVar1) {
      in_stack_ffffffffffffffb8 = *(TemplatedValidityMask<unsigned_long> **)&psVar2[iVar3].value;
      input.value.pointer.ptr = (char *)iVar3;
      input.value._0_8_ = iVar4;
      in_stack_ffffffffffffffa8 = SortKeyBlobOperator::GetEncodeLength(input);
      pvVar5 = vector<unsigned_long,_false>::operator[]
                         ((vector<unsigned_long,_false> *)this,in_stack_ffffffffffffffa8);
      *pvVar5 = in_stack_ffffffffffffffa8 + *pvVar5;
    }
  }
  return;
}

Assistant:

void TemplatedGetSortKeyLength(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyLengthInfo &result) {
	auto &format = vector_data.format;
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto idx = format.sel->get_index(r);
		auto result_index = chunk.GetResultIndex(r);
		result.variable_lengths[result_index]++; // every value is prefixed by a validity byte

		if (!format.validity.RowIsValid(idx)) {
			continue;
		}
		result.variable_lengths[result_index] += OP::GetEncodeLength(data[idx]);
	}
}